

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastGtR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  long lVar1;
  uint32_t uVar2;
  TcParseTableBase *pTVar3;
  bool bVar4;
  uint uVar5;
  MessageLite *pMVar6;
  ulong uVar7;
  string *psVar8;
  char *pcVar9;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar10;
  undefined8 uVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar12;
  int iVar13;
  RepeatedPtrFieldBase *ptr_00;
  uint *puVar14;
  undefined8 uVar15;
  uint32_t uVar16;
  int iVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  RepeatedPtrFieldBase local_60;
  RepeatedPtrFieldBase *local_48;
  TcParseTableBase *local_40;
  TcParseTableBase *local_38;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar9 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar9;
  }
  local_48 = (RepeatedPtrFieldBase *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30))
  ;
  if (((ulong)local_48 & 7) != 0) {
    AlignFail(local_48);
  }
  uVar16 = (uint32_t)(byte)*ptr;
  aVar10.data = (ulong)data.field_0 >> 0x18 & 0xff;
  local_38 = *(TcParseTableBase **)
              ((long)&table->has_bits_offset + aVar10.data * 8 + (ulong)table->aux_offset);
  local_40 = local_38 + 1;
  local_60.arena_._4_4_ = (uint)(byte)*ptr;
  do {
    ptr_00 = local_48;
    pMVar6 = AddMessage(local_38,local_48);
    pTVar3 = local_40;
    auVar19._8_8_ = extraout_RDX;
    auVar19._0_8_ = local_60.tagged_rep_or_elem_;
    iVar17 = ctx->depth_;
    lVar1 = (long)iVar17 + -1;
    iVar13 = (int)lVar1;
    ctx->depth_ = iVar13;
    if ((long)iVar17 < 1) {
      ptr = (char *)0x0;
    }
    else {
      lVar18 = (long)ctx->group_depth_ + 1;
      iVar17 = (int)lVar18;
      ctx->group_depth_ = iVar17;
      local_60.tagged_rep_or_elem_ =
           (RepeatedPtrFieldBase *)((long)&((RepeatedPtrFieldBase *)ptr)->tagged_rep_or_elem_ + 1);
      while( true ) {
        ptr_00 = &local_60;
        bVar4 = EpsCopyInputStream::DoneWithCheck
                          (&ctx->super_EpsCopyInputStream,(char **)&local_60,ctx->group_depth_);
        auVar19._8_8_ = extraout_RDX_00;
        auVar19._0_8_ = local_60.tagged_rep_or_elem_;
        if (bVar4) break;
        uVar5 = (uint)pTVar3[-1].fast_idx_mask &
                (uint)*(ushort *)(void **)local_60.tagged_rep_or_elem_;
        if ((uVar5 & 7) != 0) goto LAB_002939aa;
        uVar7 = (ulong)(uVar5 & 0xfffffff8);
        aVar10.data = (ulong)*(ushort *)(void **)local_60.tagged_rep_or_elem_ ^
                      *(ulong *)(&pTVar3->fast_idx_mask + uVar7 * 2);
        auVar19 = (**(code **)(&pTVar3->has_bits_offset + uVar7))
                            (pMVar6,local_60.tagged_rep_or_elem_,ctx,aVar10.data,pTVar3 + -1,0);
        ptr_00 = (RepeatedPtrFieldBase *)local_60.tagged_rep_or_elem_;
        if ((auVar19._0_8_ == (RepeatedPtrFieldBase *)0x0) ||
           (local_60.tagged_rep_or_elem_ = auVar19._0_8_,
           (ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
      }
      local_60.tagged_rep_or_elem_ = auVar19._0_8_;
      ptr = (char *)local_60.tagged_rep_or_elem_;
      if ((pTVar3[-1].field_0x9 & 1) != 0) {
        ptr_00 = (RepeatedPtrFieldBase *)local_60.tagged_rep_or_elem_;
        auVar20 = (undefined1  [16])
                  (*pTVar3[-1].post_loop_handler)(pMVar6,(char *)local_60.tagged_rep_or_elem_,ctx);
        auVar19._8_8_ = auVar20._8_8_;
        auVar19._0_8_ = local_60.tagged_rep_or_elem_;
        ptr = (char *)auVar20._0_8_;
      }
      local_60.tagged_rep_or_elem_ = auVar19._0_8_;
      if ((RepeatedPtrFieldBase *)ptr != (RepeatedPtrFieldBase *)0x0) {
        if (iVar13 == ctx->depth_) {
          psVar8 = (string *)0x0;
        }
        else {
          psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                             (lVar1,(long)ctx->depth_,"old_depth == depth_");
          auVar19._8_8_ = extraout_RDX_01;
          auVar19._0_8_ = local_60.tagged_rep_or_elem_;
        }
        local_60.tagged_rep_or_elem_ = auVar19._0_8_;
        if (psVar8 != (string *)0x0) {
          uVar15 = *(undefined8 *)psVar8;
          uVar11 = *(undefined8 *)(psVar8 + 8);
          uVar12 = 0x45b;
LAB_002939fa:
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_60,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                     ,uVar12,uVar11,uVar15);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_60);
        }
        ptr_00 = (RepeatedPtrFieldBase *)(long)ctx->group_depth_;
        if (iVar17 == ctx->group_depth_) {
          psVar8 = (string *)0x0;
        }
        else {
          psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                             (lVar18,(long)ptr_00,"old_group_depth == group_depth_");
          auVar19._8_8_ = extraout_RDX_02;
          auVar19._0_8_ = local_60.tagged_rep_or_elem_;
        }
        local_60.tagged_rep_or_elem_ = auVar19._0_8_;
        if (psVar8 != (string *)0x0) {
          uVar15 = *(undefined8 *)psVar8;
          uVar11 = *(undefined8 *)(psVar8 + 8);
          uVar12 = 0x45c;
          goto LAB_002939fa;
        }
      }
      ctx->group_depth_ = ctx->group_depth_ + -1;
      ctx->depth_ = ctx->depth_ + 1;
      uVar2 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
      uVar16 = local_60.arena_._4_4_;
      if (uVar2 != local_60.arena_._4_4_) {
        ptr = (char *)0x0;
      }
    }
    local_60.tagged_rep_or_elem_ = auVar19._0_8_;
    if ((RepeatedPtrFieldBase *)ptr == (RepeatedPtrFieldBase *)0x0) {
      pcVar9 = Error(msg,(char *)ptr_00,auVar19._8_8_,(TcFieldData)aVar10,table,hasbits);
      return pcVar9;
    }
    if ((RepeatedPtrFieldBase *)(ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar14 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar14 & 3) != 0) {
          AlignFail();
        }
        *puVar14 = *puVar14 | (uint)hasbits;
      }
      return (char *)(RepeatedPtrFieldBase *)ptr;
    }
    if (*(char *)&((RepeatedPtrFieldBase *)ptr)->tagged_rep_or_elem_ != (char)uVar16) {
      uVar5 = (uint)table->fast_idx_mask &
              (uint)*(ushort *)&((RepeatedPtrFieldBase *)ptr)->tagged_rep_or_elem_;
      if ((uVar5 & 7) == 0) {
        uVar7 = (ulong)(uVar5 & 0xfffffff8);
        pcVar9 = (char *)(**(code **)(&table[1].has_bits_offset + uVar7))
                                   (msg,ptr,ctx,
                                    (ulong)*(ushort *)
                                            &((RepeatedPtrFieldBase *)ptr)->tagged_rep_or_elem_ ^
                                    *(ulong *)(&table[1].fast_idx_mask + uVar7 * 2),table,hasbits);
        return pcVar9;
      }
LAB_002939aa:
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGtR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint8_t, true, true>(
      PROTOBUF_TC_PARAM_PASS);
}